

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1)

{
  Token name;
  InstanceNameSyntax *this_00;
  
  this_00 = (InstanceNameSyntax *)allocate(this,0x60,8);
  name.kind = args->kind;
  name._2_1_ = args->field_0x2;
  name.numFlags.raw = (args->numFlags).raw;
  name.rawLen = args->rawLen;
  name.info = args->info;
  slang::syntax::InstanceNameSyntax::InstanceNameSyntax(this_00,name,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }